

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall
doctest::anon_unknown_15::ConsoleReporter::file_line_to_stream
          (ConsoleReporter *this,char *file,int line,char *tail)

{
  char *pcVar1;
  ostream *poVar2;
  int iVar3;
  
  poVar2 = this->s;
  Color::operator<<(poVar2,LightGrey);
  pcVar1 = skipPathFromFilename(file);
  poVar2 = std::operator<<(poVar2,pcVar1);
  pcVar1 = "(";
  if (this->opt->gnu_file_line != false) {
    pcVar1 = ":";
  }
  poVar2 = std::operator<<(poVar2,pcVar1);
  iVar3 = 0;
  if (this->opt->no_line_numbers == false) {
    iVar3 = line;
  }
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
  pcVar1 = "):";
  if (this->opt->gnu_file_line != false) {
    pcVar1 = ":";
  }
  poVar2 = std::operator<<(poVar2,pcVar1);
  std::operator<<(poVar2,tail);
  return;
}

Assistant:

virtual void file_line_to_stream(const char* file, int line,
                                        const char* tail = "") {
            s << Color::LightGrey << skipPathFromFilename(file) << (opt.gnu_file_line ? ":" : "(")
            << (opt.no_line_numbers ? 0 : line) // 0 or the real num depending on the option
            << (opt.gnu_file_line ? ":" : "):") << tail;
        }